

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriggerVariable.hpp
# Opt level: O1

bool __thiscall
gmlc::concurrency::TriggerVariable::wait_forActivation(TriggerVariable *this,milliseconds *duration)

{
  bool bVar1;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = &this->activeLock;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  bVar1 = true;
  if (((this->activated)._M_base._M_i & 1U) == 0) {
    bVar1 = std::condition_variable::
            wait_for<long,std::ratio<1l,1000l>,gmlc::concurrency::TriggerVariable::wait_forActivation(std::chrono::duration<long,std::ratio<1l,1000l>>const&)const::_lambda()_1_>
                      (&this->cv_active,&local_30,duration,(anon_class_8_1_8991fb9c)this);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return bVar1;
}

Assistant:

bool wait_forActivation(const std::chrono::milliseconds& duration) const
    {
        std::unique_lock<std::mutex> lk(activeLock);
        if (!activated) {
            return cv_active.wait_for(lk, duration, [this] {
                return activated.load();
            });
        }
        return true;
    }